

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestPickleNestedMessage_NestedMessage_NestedNestedMessage::Clear
          (TestPickleNestedMessage_NestedMessage_NestedNestedMessage *this)

{
  uint32_t cached_has_bits;
  TestPickleNestedMessage_NestedMessage_NestedNestedMessage *this_local;
  
  (this->field_0)._impl_.cc_ = 0;
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestPickleNestedMessage_NestedMessage_NestedNestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestPickleNestedMessage.NestedMessage.NestedNestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.cc_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}